

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

void __thiscall boomphf::bfile_iterator<unsigned_long>::advance(bfile_iterator<unsigned_long> *this)

{
  size_t sVar1;
  undefined8 *in_RDI;
  int res;
  
  in_RDI[2] = in_RDI[2] + 1;
  if (*(int *)(in_RDI + 4) <= *(int *)((long)in_RDI + 0x24)) {
    sVar1 = fread((void *)in_RDI[3],8,(long)*(int *)(in_RDI + 5),(FILE *)in_RDI[1]);
    *(int *)(in_RDI + 4) = (int)sVar1;
    *(undefined4 *)((long)in_RDI + 0x24) = 0;
    if ((int)sVar1 == 0) {
      in_RDI[1] = 0;
      in_RDI[2] = 0;
      return;
    }
  }
  *in_RDI = *(undefined8 *)(in_RDI[3] + (long)*(int *)((long)in_RDI + 0x24) * 8);
  *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + 1;
  return;
}

Assistant:

void advance()
		{
			
			//printf("_cptread %i _inbuff %i \n",_cptread,_inbuff);
			
			_pos++;
			
			if(_cptread >= _inbuff)
			{

				int res = fread(_buffer,sizeof(basetype),_buffsize,_is);

				//printf("read %i new elem last %llu  %p\n",res,_buffer[res-1],_is);
				_inbuff = res; _cptread = 0;
				
				if(res == 0)
				{
					_is = nullptr;
					_pos = 0;
					return;
				}
			}
			
			_elem = _buffer[_cptread];
			_cptread ++;
		}